

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

bool comparesEqual(QString *s1,QString *s2)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView local_28;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.m_data = (s1->d).ptr;
  local_18.m_size = (s1->d).size;
  local_28.m_data = (s2->d).ptr;
  local_28.m_size = (s2->d).size;
  bVar1 = comparesEqual(&local_18,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

friend bool comparesEqual(const QString &s1, const QString &s2) noexcept
    { return comparesEqual(QStringView(s1), QStringView(s2)); }